

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall
QTreeWidgetItem::QTreeWidgetItem(QTreeWidgetItem *this,QTreeWidget *treeview,int type)

{
  long lVar1;
  QFlags<Qt::ItemFlag> QVar2;
  QTreeWidgetItemPrivate *v;
  QTreeModel *pQVar3;
  int in_EDX;
  QList<QList<QWidgetItemData>_> *in_RSI;
  QTreeWidgetItem *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000018;
  QTreeModel *model;
  undefined4 in_stack_ffffffffffffffa8;
  ItemFlag in_stack_ffffffffffffffac;
  QTreeWidgetItem *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->_vptr_QTreeWidgetItem = (_func_int **)&PTR__QTreeWidgetItem_00d31678;
  in_RDI->rtti = in_EDX;
  QList<QList<QWidgetItemData>_>::QList((QList<QList<QWidgetItemData>_> *)0x912e2c);
  in_RDI->view = (QTreeWidget *)0x0;
  v = (QTreeWidgetItemPrivate *)operator_new(0x30);
  QTreeWidgetItemPrivate::QTreeWidgetItemPrivate
            ((QTreeWidgetItemPrivate *)in_stack_ffffffffffffffb0,
             (QTreeWidgetItem *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  in_RDI->d = v;
  in_RDI->par = (QTreeWidgetItem *)0x0;
  QList<QTreeWidgetItem_*>::QList((QList<QTreeWidgetItem_*> *)0x912e74);
  Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                (enum_type)in_stack_ffffffffffffffb0);
  QFlags<Qt::ItemFlag>::operator|
            ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  QFlags<Qt::ItemFlag>::operator|
            ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  QVar2 = QFlags<Qt::ItemFlag>::operator|
                    ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  (in_RDI->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
       = (Int)QVar2.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i;
  pQVar3 = treeModel(in_RDI,(QTreeWidget *)v);
  if (pQVar3 != (QTreeModel *)0x0) {
    addChild(in_stack_ffffffffffffffb0,
             (QTreeWidgetItem *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    columnCount((QTreeWidgetItem *)0x912f0a);
    QList<QList<QWidgetItemData>_>::reserve(in_RSI,in_stack_00000018);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem::QTreeWidgetItem(QTreeWidget *treeview, int type)
    : rtti(type), d(new QTreeWidgetItemPrivate(this))
{
    // do not set this->view here otherwise insertChild() will fail
    if (QTreeModel *model = treeModel(treeview)) {
        model->rootItem->addChild(this);
        values.reserve(model->headerItem->columnCount());
    }
}